

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_object.c
# Opt level: O2

int main(void)

{
  int iVar1;
  
  item[0].valuedouble = 0.0;
  item[0].string = (char *)0x0;
  item[0].valuestring = (char *)0x0;
  item[0].valueint = 0;
  item[0]._44_4_ = 0;
  item[0].child = (cJSON *)0x0;
  item[0].type = 0;
  item[0]._28_4_ = 0;
  item[0].next = (cJSON *)0x0;
  item[0].prev = (cJSON *)0x0;
  UnityBegin(
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/deps/cJSON/tests/parse_object.c"
            );
  UnityDefaultTestRun(parse_object_should_parse_empty_objects,
                      "parse_object_should_parse_empty_objects",0xab);
  UnityDefaultTestRun(parse_object_should_not_parse_non_objects,
                      "parse_object_should_not_parse_non_objects",0xac);
  UnityDefaultTestRun(parse_object_should_parse_objects_with_multiple_elements,
                      "parse_object_should_parse_objects_with_multiple_elements",0xad);
  UnityDefaultTestRun(parse_object_should_parse_objects_with_one_element,
                      "parse_object_should_parse_objects_with_one_element",0xae);
  iVar1 = UnityEnd();
  return iVar1;
}

Assistant:

main(void)
{
    /* initialize cJSON item */
    memset(item, 0, sizeof(cJSON));

    UNITY_BEGIN();
    RUN_TEST(parse_object_should_parse_empty_objects);
    RUN_TEST(parse_object_should_not_parse_non_objects);
    RUN_TEST(parse_object_should_parse_objects_with_multiple_elements);
    RUN_TEST(parse_object_should_parse_objects_with_one_element);
    return UNITY_END();
}